

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9150.cpp
# Opt level: O2

bool __thiscall RTIMUMPU9150::IMUInit(RTIMUMPU9150 *this)

{
  RTIMUSettings *pRVar1;
  bool bVar2;
  undefined8 in_RAX;
  uchar result;
  
  result = (uchar)((ulong)in_RAX >> 0x38);
  this->m_firstTime = true;
  this->m_cacheCount = 0;
  this->m_cacheIn = 0;
  this->m_cacheOut = 0;
  (this->super_RTIMU).m_imuData.fusionPoseValid = false;
  (this->super_RTIMU).m_imuData.fusionQPoseValid = false;
  (this->super_RTIMU).m_imuData.gyroValid = true;
  (this->super_RTIMU).m_imuData.accelValid = true;
  (this->super_RTIMU).m_imuData.compassValid = true;
  (this->super_RTIMU).m_imuData.pressureValid = false;
  (this->super_RTIMU).m_imuData.temperatureValid = false;
  (this->super_RTIMU).m_imuData.humidityValid = false;
  pRVar1 = (this->super_RTIMU).m_settings;
  this->m_slaveAddr = pRVar1->m_I2CSlaveAddress;
  setSampleRate(this,pRVar1->m_MPU9150GyroAccelSampleRate);
  setCompassRate(this,((this->super_RTIMU).m_settings)->m_MPU9150CompassSampleRate);
  setLpf(this,(uchar)((this->super_RTIMU).m_settings)->m_MPU9150GyroAccelLpf);
  setGyroFsr(this,(uchar)((this->super_RTIMU).m_settings)->m_MPU9150GyroFsr);
  setAccelFsr(this,(uchar)((this->super_RTIMU).m_settings)->m_MPU9150AccelFsr);
  RTIMU::setCalibrationData(&this->super_RTIMU);
  bVar2 = RTIMUHal::HALOpen(&((this->super_RTIMU).m_settings)->super_RTIMUHal);
  if (!bVar2) {
    return false;
  }
  bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,'k'
                             ,0x80,"Failed to initiate MPU9150 reset");
  if (bVar2) {
    RTIMUHal::delayMs(&((this->super_RTIMU).m_settings)->super_RTIMUHal,100);
    bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                               'k','\0',"Failed to stop MPU9150 reset");
    if (!bVar2) {
      return false;
    }
    bVar2 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                              'u','\x01',&result,"Failed to read MPU9150 id");
    if (bVar2) {
      if (result != 'h') {
        fprintf(_stderr,"Incorrect MPU9150 id %d\n");
        return false;
      }
      bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr
                                 ,'\x1a',this->m_lpf,"Failed to set lpf");
      if ((((bVar2) && (bVar2 = setSampleRate(this), bVar2)) &&
          (bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                      this->m_slaveAddr,'\x1b',this->m_gyroFsr,
                                      "Failed to set gyro fsr"), bVar2)) &&
         (((bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                       this->m_slaveAddr,'\x1c',this->m_accelFsr,
                                       "Failed to set accel fsr"), bVar2 &&
           (bVar2 = configureCompass(this), bVar2)) &&
          (bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                      this->m_slaveAddr,'k','\x01',"Failed to set pwr_mgmt_1"),
          bVar2)))) {
        bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                   this->m_slaveAddr,'l','\0',"Failed to set pwr_mgmt_2");
        if (!bVar2) {
          return false;
        }
        bVar2 = resetFifo(this);
        if (bVar2) {
          RTIMU::gyroBiasInit(&this->super_RTIMU);
          puts("MPU9150 init complete");
          fflush(_stdout);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool RTIMUMPU9150::IMUInit()
{
    unsigned char result;

    m_firstTime = true;

#ifdef MPU9150_CACHE_MODE
    m_cacheIn = m_cacheOut = m_cacheCount = 0;
#endif

    // set validity flags

    m_imuData.fusionPoseValid = false;
    m_imuData.fusionQPoseValid = false;
    m_imuData.gyroValid = true;
    m_imuData.accelValid = true;
    m_imuData.compassValid = true;
    m_imuData.pressureValid = false;
    m_imuData.temperatureValid = false;
    m_imuData.humidityValid = false;

    //  configure IMU

    m_slaveAddr = m_settings->m_I2CSlaveAddress;

    setSampleRate(m_settings->m_MPU9150GyroAccelSampleRate);
    setCompassRate(m_settings->m_MPU9150CompassSampleRate);
    setLpf(m_settings->m_MPU9150GyroAccelLpf);
    setGyroFsr(m_settings->m_MPU9150GyroFsr);
    setAccelFsr(m_settings->m_MPU9150AccelFsr);

    setCalibrationData();

    //  enable the I2C bus

    if (!m_settings->HALOpen())
        return false;

    //  reset the MPU9150

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_PWR_MGMT_1, 0x80, "Failed to initiate MPU9150 reset"))
        return false;

    m_settings->delayMs(100);

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_PWR_MGMT_1, 0x00, "Failed to stop MPU9150 reset"))
        return false;

    if (!m_settings->HALRead(m_slaveAddr, MPU9150_WHO_AM_I, 1, &result, "Failed to read MPU9150 id"))
        return false;

    if (result != MPU9150_ID) {
        HAL_ERROR1("Incorrect MPU9150 id %d\n", result);
        return false;
    }

    //  now configure the various components

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_LPF_CONFIG, m_lpf, "Failed to set lpf"))
        return false;

    if (!setSampleRate())
        return false;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_GYRO_CONFIG, m_gyroFsr, "Failed to set gyro fsr"))
        return false;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_ACCEL_CONFIG, m_accelFsr, "Failed to set accel fsr"))
         return false;

    //  now configure compass

    if (!configureCompass())
        return false;

    //  enable the sensors

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_PWR_MGMT_1, 1, "Failed to set pwr_mgmt_1"))
        return false;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_PWR_MGMT_2, 0, "Failed to set pwr_mgmt_2"))
         return false;

    //  select the data to go into the FIFO and enable

    if (!resetFifo())
        return false;

    gyroBiasInit();

    HAL_INFO("MPU9150 init complete\n");
    return true;
}